

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O1

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::thread_settings>::check_limits
          (mem_cache<cppcms::impl::thread_settings> *this)

{
  _Base_ptr p_Var1;
  long in_RAX;
  ulong uVar2;
  _List_node_base *p_Var3;
  time_t now;
  long local_18;
  
  local_18 = in_RAX;
  time(&local_18);
  uVar2 = this->size;
  if (uVar2 != 0) {
    do {
      if ((ulong)this->limit == 0) {
        return;
      }
      if (uVar2 < this->limit) {
        return;
      }
      if (((this->timeout)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (p_Var1 = (this->timeout)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
         local_18 <= *(long *)(p_Var1 + 1))) {
        if ((this->lru).
            super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
            ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->lru) {
          return;
        }
        p_Var3 = (this->lru).
                 super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
                 ._M_impl._M_node.super__List_node_base._M_prev + 1;
      }
      else {
        p_Var3 = (_List_node_base *)&p_Var1[1]._M_parent;
      }
      delete_node(this,(iterator)p_Var3->_M_next);
      uVar2 = this->size;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void check_limits()
	{
		pointer main=primary.end();
		time_t now;
		time(&now);

		while(size > 0 && (not_enough_memory() || (size>=limit && limit>0)))
		{
			if(!timeout.empty() && timeout.begin()->first<now) {
				main=timeout.begin()->second;
			}
			else if(!lru.empty()){
				main=*lru.rbegin();
			}
			else
				break;
			delete_node(main);
		}
	}